

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Cues::Init(Cues *this)

{
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  longlong size;
  longlong id;
  long len;
  longlong idpos;
  long cue_points_size;
  longlong pos;
  longlong stop;
  IMkvReader *pReader;
  Cues *this_local;
  
  if (this->m_cue_points == (CuePoint **)0x0) {
    if ((this->m_count == 0) && (this->m_preload_count == 0)) {
      stop = (longlong)this->m_pSegment->m_pReader;
      pos = this->m_start + this->m_size;
      cue_points_size = this->m_start;
      idpos = 0;
      pReader = (IMkvReader *)this;
      for (; cue_points_size < pos; cue_points_size = lVar3 + cue_points_size) {
        len = cue_points_size;
        lVar2 = ReadID((IMkvReader *)stop,cue_points_size,&id);
        if ((lVar2 < 0) || (pos < cue_points_size + id)) {
          return false;
        }
        cue_points_size = id + cue_points_size;
        lVar3 = ReadUInt((IMkvReader *)stop,cue_points_size,&id);
        if ((lVar3 < 0) || (pos < cue_points_size + id)) {
          return false;
        }
        cue_points_size = id + cue_points_size;
        if (pos < cue_points_size + lVar3) {
          return false;
        }
        if ((lVar2 == 0xbb) && (bVar1 = PreloadCuePoint(this,&idpos,len), !bVar1)) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Cues::Init() const {
  if (m_cue_points)
    return true;

  if (m_count != 0 || m_preload_count != 0)
    return false;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  const long long stop = m_start + m_size;
  long long pos = m_start;

  long cue_points_size = 0;

  while (pos < stop) {
    const long long idpos = pos;

    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if (size < 0 || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if (pos + size > stop) {
      return false;
    }

    if (id == libwebm::kMkvCuePoint) {
      if (!PreloadCuePoint(cue_points_size, idpos))
        return false;
    }

    pos += size;  // skip payload
  }
  return true;
}